

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abin.c
# Opt level: O0

void addNeighbor(atom *a,atomBins *bins)

{
  atomBins *bins_local;
  atom *a_local;
  
  binLoc(&a->loc,&a->ix,&a->iy,&a->iz,bins);
  a->binSerialNum = bins->binSerialNum;
  a->nextInBin = bins->list[a->ix][a->iy][a->iz];
  bins->list[a->ix][a->iy][a->iz] = a;
  return;
}

Assistant:

void addNeighbor(atom *a, atomBins *bins) {

	binLoc(&(a->loc), &(a->ix), &(a->iy), &(a->iz), bins);

	/* record bin identifier */
	a->binSerialNum = bins->binSerialNum;

	/* add atom in as first link in neighbor list */
	a->nextInBin = bins->list[a->ix][a->iy][a->iz];

	bins->list[a->ix][a->iy][a->iz] = a;
}